

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_reporter_tests.c
# Opt level: O0

void setup_xml_reporter_tests(void)

{
  int iVar1;
  
  reporter = (TestReporter *)create_xml_reporter("PREFIX");
  iVar1 = start_cgreen_messaging(0x29b);
  reporter->ipc = iVar1;
  clear_output();
  set_xml_reporter_printer(reporter,mocked_printf);
  return;
}

Assistant:

static void setup_xml_reporter_tests(void) {
    reporter = create_xml_reporter("PREFIX");

    // We can not use setup_reporting() since we are running
    // inside a test suite which needs the real reporting
    // So we'll have to set up the messaging explicitly
    reporter->ipc = start_cgreen_messaging(667);

    clear_output();
    set_xml_reporter_printer(reporter, mocked_printf);
}